

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O2

BOOL DBG_init_channels(void)

{
  char cVar1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char *pvMem;
  char *pcVar7;
  undefined8 *puVar8;
  uint *puVar9;
  char *__s;
  char **ppcVar10;
  uint *local_48;
  
  InternalInitializeCriticalSection(&fprintf_crit_section);
  for (lVar5 = 0; lVar5 != 0x17; lVar5 = lVar5 + 1) {
    dbg_channel_flags[lVar5] = 0x10;
  }
  pcVar6 = MiscGetenv("PAL_DBG_CHANNELS");
  pvMem = (char *)0x0;
  if ((pcVar6 != (char *)0x0) && (pvMem = PAL__strdup(pcVar6), pvMem == (char *)0x0))
  goto LAB_00130b06;
  local_48 = (uint *)&DAT_0018c13c;
  pcVar6 = pvMem;
LAB_00130836:
  if (pcVar6 != (char *)0x0) {
    do {
      __s = pcVar6 + 1;
      cVar1 = *pcVar6;
      if (cVar1 == '\0') goto LAB_001309c4;
    } while ((cVar1 != '+') && (pcVar6 = __s, cVar1 != '-'));
    pcVar7 = strchr(__s,0x3a);
    if (pcVar7 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = pcVar7 + 1;
      *pcVar7 = '\0';
    }
    pcVar7 = strchr(__s,0x2e);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
      iVar3 = strcmp(pcVar7 + 1,"all");
      if (iVar3 == 0) {
        uVar4 = 0;
        if (cVar1 == '+') {
          uVar4 = 0xffff;
        }
LAB_00130916:
        uVar2 = uVar4 & 0xffffffde;
        if ((uVar4 & 1) != 0) {
          uVar2 = uVar4 | 0x20;
        }
        iVar3 = strcmp(__s,"all");
        if (iVar3 == 0) {
          lVar5 = 0;
          if (cVar1 != '+') {
            for (; lVar5 != 0x17; lVar5 = lVar5 + 1) {
              dbg_channel_flags[lVar5] = dbg_channel_flags[lVar5] & uVar2;
            }
          }
          else {
            for (; lVar5 != 0x17; lVar5 = lVar5 + 1) {
              dbg_channel_flags[lVar5] = dbg_channel_flags[lVar5] | uVar2;
            }
          }
        }
        else {
          lVar5 = 0;
          puVar9 = local_48;
          do {
            if (lVar5 == 0xb8) goto LAB_00130836;
            iVar3 = strcmp(__s,*(char **)((long)dbg_channel_names + lVar5));
            puVar9 = puVar9 + 1;
            lVar5 = lVar5 + 8;
          } while (iVar3 != 0);
          uVar4 = *puVar9 | uVar2;
          if (cVar1 != '+') {
            uVar4 = *puVar9 & uVar2;
          }
          *puVar9 = uVar4;
        }
      }
      else {
        ppcVar10 = dbg_level_names;
        for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
          iVar3 = strcmp(pcVar7 + 1,*ppcVar10);
          if (iVar3 == 0) {
            uVar4 = -(uint)(cVar1 != '+') ^ 1 << ((uint)lVar5 & 0x1f);
            goto LAB_00130916;
          }
          ppcVar10 = ppcVar10 + 1;
        }
      }
    }
    goto LAB_00130836;
  }
LAB_001309c4:
  PAL_free(pvMem);
  pcVar6 = MiscGetenv("PAL_API_TRACING");
  if (((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) ||
     (iVar3 = strcmp(pcVar6,"stderr"), iVar3 == 0)) {
    puVar8 = (undefined8 *)&stderr;
LAB_00130a55:
    output_file = (FILE *)*puVar8;
  }
  else {
    iVar3 = strcmp(pcVar6,"stdout");
    if (iVar3 == 0) {
      puVar8 = (undefined8 *)&stdout;
      goto LAB_00130a55;
    }
    output_file = (FILE *)fopen64(pcVar6,"at");
    if ((FILE *)output_file == (FILE *)0x0) {
      output_file = (FILE *)_stderr;
      fprintf(_stderr,
              "Can\'t open %s for writing : debug messages will go to stderr. Check your PAL_API_TRACING variable!\n"
              ,pcVar6);
    }
  }
  pcVar6 = MiscGetenv("PAL_DISABLE_ASSERTS");
  if ((pcVar6 == (char *)0x0) || (iVar3 = strcmp(pcVar6,"1"), iVar3 != 0)) {
    g_Dbg_asserts_enabled = 1;
  }
  else {
    g_Dbg_asserts_enabled = 0;
  }
  pcVar6 = MiscGetenv("PAL_API_LEVELS");
  if (pcVar6 == (char *)0x0) {
    max_entry_level = 1;
  }
  else {
    max_entry_level = atoi(pcVar6);
    if (max_entry_level == 0) {
      return 1;
    }
  }
  uVar4 = pthread_key_create(&entry_level_key,(__destr_function *)0x0);
  __stream = _stderr;
  if (uVar4 == 0) {
    return 1;
  }
  pcVar6 = strerror(uVar4);
  fprintf(__stream,"ERROR : pthread_key_create() failed error:%d (%s)\n",(ulong)uVar4,pcVar6);
LAB_00130b06:
  DeleteCriticalSection(&fprintf_crit_section);
  return 0;
}

Assistant:

BOOL DBG_init_channels(void)
{
    INT i;
    LPCSTR env_string;
    LPSTR env_workstring;
    LPSTR env_pcache;
    LPSTR entry_ptr;
    LPSTR level_ptr;
    CHAR plus_or_minus;
    DWORD flag_mask = 0;
    int ret;

    InternalInitializeCriticalSection(&fprintf_crit_section);

    /* output only asserts by default [only affects no-vararg-support case; if
       we have varargs, these flags aren't even checked for ASSERTs] */
    for(i=0;i<DCI_LAST;i++)
        dbg_channel_flags[i]=1<<DLI_ASSERT;

    /* parse PAL_DBG_CHANNELS environment variable */

    if (!(env_string = MiscGetenv(ENV_CHANNELS)))
    {
        env_pcache = env_workstring = NULL;
    }
    else
    {
        env_pcache = env_workstring = PAL__strdup(env_string);

        if (env_workstring == NULL)
        {
            /* Not enough memory */
            DeleteCriticalSection(&fprintf_crit_section);
            return FALSE;
        }
    }
    while(env_workstring)
    {
        entry_ptr=env_workstring;

        /* find beginning of next entry */
        while((*entry_ptr != '\0') &&(*entry_ptr != '+') && (*entry_ptr != '-'))
        {
            entry_ptr++;
        }

        /* break if end of string is reached */
        if(*entry_ptr == '\0')
        {
           break;
        }

        plus_or_minus=*entry_ptr++;

        /* find end of entry; if strchr returns NULL, we have reached the end
           of the string and we will leave the loop at the end of this pass. */
        env_workstring=strchr(entry_ptr,':');

        /* NULL-terminate entry, make env_string point to rest of string */
        if(env_workstring)
        {
            *env_workstring++='\0';
        }

        /* find period that separates channel name from level name */
        level_ptr=strchr(entry_ptr,'.');

        /* an entry with no period is illegal : ignore it */
        if(!level_ptr)
        {
            continue;
        }
        /* NULL-terminate channel name, make level_ptr point to the level name */
        *level_ptr++='\0';

        /* build the flag mask based on requested level */

        /* if "all" level is specified, we want to open/close all levels at
           once, so mask is either all ones or all zeroes */
        if(!strcmp(level_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                flag_mask=0xFFFF;  /* OR this to open all levels */
            }
            else
            {
                flag_mask=0;       /* AND this to close all levels*/
            }
        }
        else
        {
            for(i=0;i<DLI_LAST;i++)
            {
                if(!strcmp(level_ptr,dbg_level_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        flag_mask=1<<i;     /* OR this to open the level */
                    }
                    else
                    {
                        flag_mask=~(1<<i);  /* AND this to close the level */
                    }
                    break;
                }
            }
            /* didn't find a matching level : skip it. */
            if(i==DLI_LAST)
            {
                continue;
            }
        }

        /* Set EXIT and ENTRY channels to be identical */
        if(!(flag_mask & (1<<DLI_ENTRY)))
        {
            flag_mask = flag_mask & (~(1<<DLI_EXIT));
        }
        else
        {
            flag_mask = flag_mask | (1<<DLI_EXIT);
        }

        /* apply the flag mask to the specified channel */

        /* if "all" channel is specified, apply mask to all channels */
        if(!strcmp(entry_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] |= flag_mask; /* OR to open levels*/
                }
            }
            else
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] &= flag_mask; /* AND to close levels */
                }
            }
        }
        else
        {
            for(i=0;i<DCI_LAST;i++)
            {
                if(!strcmp(entry_ptr,dbg_channel_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        dbg_channel_flags[i] |= flag_mask;
                    }
                    else
                    {
                        dbg_channel_flags[i] &= flag_mask;
                    }

                    break;
                }
            }
            /* ignore the entry if the channel name is unknown */
        }
        /* done processing this entry; on to the next. */
    }
    PAL_free(env_pcache);

    /* select output file */
    env_string=MiscGetenv(ENV_FILE);
    if(env_string && *env_string!='\0')
    {
        if(!strcmp(env_string, "stderr"))
        {
            output_file = stderr;
        }
        else if(!strcmp(env_string, "stdout"))
        {
            output_file = stdout;
        }
        else
        {
            output_file = fopen(env_string,FOPEN_FLAGS);

            /* if file can't be opened, default to stderr */
            if(!output_file)
            {
                output_file = stderr;
                fprintf(stderr, "Can't open %s for writing : debug messages "
                        "will go to stderr. Check your PAL_API_TRACING "
                        "variable!\n", env_string);
            }
        }
    }
    else
    {
        output_file = stderr; /* output to stderr by default */
    }

    /* see if we need to disable assertions */
    env_string = MiscGetenv(ENV_ASSERTS);
    if(env_string && 0 == strcmp(env_string,"1"))
    {
        g_Dbg_asserts_enabled = FALSE;
    }
    else
    {
        g_Dbg_asserts_enabled = TRUE;
    }

    /* select ENTRY level limitation */
    env_string = MiscGetenv(ENV_ENTRY_LEVELS);
    if(env_string)
    {
        max_entry_level = atoi(env_string);
    }
    else
    {
        max_entry_level = 1;
    }

    /* if necessary, allocate TLS key for entry nesting level */
    if(0 != max_entry_level)
    {
        if ((ret = pthread_key_create(&entry_level_key,NULL)) != 0)
        {
            fprintf(stderr, "ERROR : pthread_key_create() failed error:%d (%s)\n",
                   ret, strerror(ret));
            DeleteCriticalSection(&fprintf_crit_section);;
            return FALSE;
        }
    }

    return TRUE;
}